

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_enc.c
# Opt level: O0

void PutSegmentHeader(VP8BitWriter *bw,VP8Encoder *enc)

{
  int iVar1;
  int iVar2;
  VP8BitWriter *bw_00;
  long in_RSI;
  int s;
  int update_data;
  VP8EncProba *proba;
  VP8EncSegmentHeader *hdr;
  int in_stack_ffffffffffffffdc;
  uint32_t value;
  
  bw_00 = (VP8BitWriter *)(in_RSI + 0xe20);
  iVar1 = VP8PutBitUniform(bw_00,in_stack_ffffffffffffffdc);
  if (iVar1 != 0) {
    value = 1;
    VP8PutBitUniform(bw_00,1);
    iVar1 = VP8PutBitUniform(bw_00,value);
    if (iVar1 != 0) {
      VP8PutBitUniform(bw_00,value);
      for (iVar1 = 0; iVar1 < 4; iVar1 = iVar1 + 1) {
        VP8PutSignedBits(bw_00,value,iVar1);
      }
      for (iVar1 = 0; iVar1 < 4; iVar1 = iVar1 + 1) {
        VP8PutSignedBits(bw_00,value,iVar1);
      }
    }
    if (*(int *)(in_RSI + 0x24) != 0) {
      for (iVar1 = 0; iVar1 < 3; iVar1 = iVar1 + 1) {
        iVar2 = VP8PutBitUniform(bw_00,value);
        if (iVar2 != 0) {
          VP8PutBits(bw_00,value,iVar1);
        }
      }
    }
  }
  return;
}

Assistant:

static void PutSegmentHeader(VP8BitWriter* const bw,
                             const VP8Encoder* const enc) {
  const VP8EncSegmentHeader* const hdr = &enc->segment_hdr_;
  const VP8EncProba* const proba = &enc->proba_;
  if (VP8PutBitUniform(bw, (hdr->num_segments_ > 1))) {
    // We always 'update' the quant and filter strength values
    const int update_data = 1;
    int s;
    VP8PutBitUniform(bw, hdr->update_map_);
    if (VP8PutBitUniform(bw, update_data)) {
      // we always use absolute values, not relative ones
      VP8PutBitUniform(bw, 1);   // (segment_feature_mode = 1. Paragraph 9.3.)
      for (s = 0; s < NUM_MB_SEGMENTS; ++s) {
        VP8PutSignedBits(bw, enc->dqm_[s].quant_, 7);
      }
      for (s = 0; s < NUM_MB_SEGMENTS; ++s) {
        VP8PutSignedBits(bw, enc->dqm_[s].fstrength_, 6);
      }
    }
    if (hdr->update_map_) {
      for (s = 0; s < 3; ++s) {
        if (VP8PutBitUniform(bw, (proba->segments_[s] != 255u))) {
          VP8PutBits(bw, proba->segments_[s], 8);
        }
      }
    }
  }
}